

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spanning_tree.cc
# Opt level: O0

void fail_send(socket_t fd,void *buf,int count)

{
  ssize_t sVar1;
  int *piVar2;
  char *pcVar3;
  ostream *poVar4;
  undefined8 uVar5;
  int in_EDX;
  void *in_RSI;
  int in_EDI;
  char __errmsg [256];
  stringstream __msg;
  string *in_stack_fffffffffffffd28;
  int in_stack_fffffffffffffd34;
  char *in_stack_fffffffffffffd38;
  vw_exception *in_stack_fffffffffffffd40;
  char local_2b8 [280];
  stringstream local_1a0 [16];
  ostream local_190 [400];
  
  sVar1 = send(in_EDI,in_RSI,(long)in_EDX,0);
  if (sVar1 == -1) {
    std::__cxx11::stringstream::stringstream(local_1a0);
    std::operator<<(local_190,"send: ");
    piVar2 = __errno_location();
    pcVar3 = strerror_r(*piVar2,local_2b8,0x100);
    if (pcVar3 == (char *)0x0) {
      poVar4 = std::operator<<(local_190,"errno = ");
      std::operator<<(poVar4,local_2b8);
    }
    else {
      std::operator<<(local_190,"errno = unknown");
    }
    uVar5 = __cxa_allocate_exception(0x38);
    std::__cxx11::stringstream::str();
    VW::vw_exception::vw_exception
              (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,in_stack_fffffffffffffd34,
               in_stack_fffffffffffffd28);
    __cxa_throw(uVar5,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  return;
}

Assistant:

void fail_send(const socket_t fd, const void* buf, const int count)
{
  if (send(fd, (char*)buf, count, 0) == -1)
    THROWERRNO("send: ");
}